

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

void __thiscall chrono::ChFunction_Sequence::Setup(ChFunction_Sequence *this)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _List_node_base *p_Var5;
  ChFunction_Fillet3 *this_00;
  _List_node_base *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _List_node_base *p_Var7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_50;
  double local_48;
  
  plVar1 = &this->functions;
  p_Var6 = (this->functions).
           super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)plVar1) {
    p_Var7 = (_List_node_base *)this->start;
    local_48 = 0.0;
    dVar8 = 0.0;
    local_50 = 0.0;
    do {
      p_Var6[3]._M_next = p_Var7;
      p_Var6[3]._M_prev = (_List_node_base *)((double)p_Var7 + (double)p_Var6[2]._M_next);
      p_Var6[4]._M_next = (_List_node_base *)0x0;
      p_Var6[4]._M_prev = (_List_node_base *)0x0;
      p_Var6[5]._M_next = (_List_node_base *)0x0;
      if (p_Var6[1]._M_next == (_List_node_base *)0x0) {
        this_00 = (ChFunction_Fillet3 *)0x0;
      }
      else {
        this_00 = (ChFunction_Fillet3 *)
                  __dynamic_cast(p_Var6[1]._M_next,&ChFunction::typeinfo,
                                 &ChFunction_Fillet3::typeinfo,0);
      }
      if (this_00 == (ChFunction_Fillet3 *)0x0) {
        this_00 = (ChFunction_Fillet3 *)0x0;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[1]._M_prev;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
      }
      if (this_00 == (ChFunction_Fillet3 *)0x0) {
        if (*(char *)&p_Var6[5]._M_prev == '\x01') {
          dVar9 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x20))(0);
          p_Var6[4]._M_next = (_List_node_base *)(local_48 - dVar9);
        }
        if (*(char *)((long)&p_Var6[5]._M_prev + 1) == '\x01') {
          dVar9 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x28))(0);
          p_Var6[4]._M_prev = (_List_node_base *)(local_50 - dVar9);
        }
        if (*(char *)((long)&p_Var6[5]._M_prev + 2) == '\x01') {
          dVar9 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x30))(0);
          p_Var6[5]._M_next = (_List_node_base *)(dVar8 - dVar9);
        }
      }
      else {
        this_00->y1 = local_48;
        ChFunction_Fillet3::SetupCoefficients(this_00);
        this_00->dy1 = local_50;
        ChFunction_Fillet3::SetupCoefficients(this_00);
        p_Var5 = p_Var6->_M_next;
        if (p_Var5 == (_List_node_base *)plVar1) {
          this_00->y2 = 0.0;
          ChFunction_Fillet3::SetupCoefficients(this_00);
          dVar8 = 0.0;
        }
        else {
          dVar8 = (double)(**(code **)(*(long *)p_Var5[1]._M_next + 0x20))(0);
          this_00->y2 = dVar8;
          ChFunction_Fillet3::SetupCoefficients(this_00);
          dVar8 = (double)(**(code **)(*(long *)p_Var5[1]._M_next + 0x28))(0);
        }
        this_00->dy2 = dVar8;
        ChFunction_Fillet3::SetupCoefficients(this_00);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = p_Var6[2]._M_next;
        auVar2 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar2);
        this_00->end = auVar2._0_8_;
        ChFunction_Fillet3::SetupCoefficients(this_00);
        p_Var6[4]._M_next = (_List_node_base *)0x0;
        p_Var6[4]._M_prev = (_List_node_base *)0x0;
        p_Var6[5]._M_next = (_List_node_base *)0x0;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      dVar8 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x20))(p_Var6[2]._M_next);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = p_Var6[2]._M_next;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = p_Var6[4]._M_prev;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar8 + (double)p_Var6[4]._M_next;
      auVar2 = vfmadd231sd_fma(auVar12,auVar10,auVar3);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (double)p_Var6[2]._M_next * (double)p_Var6[5]._M_next;
      auVar2 = vfmadd213sd_fma(auVar14,auVar10,auVar2);
      local_48 = auVar2._0_8_;
      dVar8 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x28))();
      auVar11._8_8_ = 0;
      auVar11._0_8_ = p_Var6[2]._M_next;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = p_Var6[5]._M_next;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar8 + (double)p_Var6[4]._M_prev;
      auVar2 = vfmadd231sd_fma(auVar13,auVar11,auVar4);
      local_50 = auVar2._0_8_;
      dVar8 = (double)(**(code **)((long)(p_Var6[1]._M_next)->_M_next + 0x30))();
      dVar8 = dVar8 + (double)p_Var6[5]._M_next;
      p_Var7 = (_List_node_base *)((double)p_Var7 + (double)p_Var6[2]._M_next);
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  return;
}

Assistant:

void ChFunction_Sequence::Setup() {
    double basetime = this->start;
    double lastIy = 0;
    double lastIy_dt = 0;
    double lastIy_dtdt = 0;

    std::list<ChFseqNode>::iterator iter_next;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        iter->t_start = basetime;
        iter->t_end = basetime + iter->duration;
        iter->Iy = 0;
        iter->Iydt = 0;
        iter->Iydtdt = 0;

        if (auto mfillet = std::dynamic_pointer_cast<ChFunction_Fillet3>(iter->fx)) {
            mfillet->Set_y1(lastIy);
            mfillet->Set_dy1(lastIy_dt);

            iter_next = iter;
            ++iter_next;
            if (iter_next != functions.end()) {
                mfillet->Set_y2(iter_next->fx->Get_y(0));
                mfillet->Set_dy2(iter_next->fx->Get_y_dx(0));
            } else {
                mfillet->Set_y2(0);
                mfillet->Set_dy2(0);
            }
            mfillet->Set_end(iter->duration);
            iter->Iy = iter->Iydt = iter->Iydtdt = 0;
        } else  // generic continuity conditions
        {
            if (iter->y_cont)
                iter->Iy = lastIy - iter->fx->Get_y(0);
            if (iter->ydt_cont)
                iter->Iydt = lastIy_dt - iter->fx->Get_y_dx(0);
            if (iter->ydtdt_cont)
                iter->Iydtdt = lastIy_dtdt - iter->fx->Get_y_dxdx(0);
        }

        lastIy = iter->fx->Get_y(iter->duration) + iter->Iy + iter->Iydt * iter->duration +
                 iter->Iydtdt * iter->duration * iter->duration;
        lastIy_dt = iter->fx->Get_y_dx(iter->duration) + iter->Iydt + iter->Iydtdt * iter->duration;
        lastIy_dtdt = iter->fx->Get_y_dxdx(iter->duration) + iter->Iydtdt;

        basetime += iter->duration;
    }
}